

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds02_is_reverse.cpp
# Opt level: O3

void __thiscall CP::vector<int>::expand(vector<int> *this,size_t capacity)

{
  int *piVar1;
  size_t sVar2;
  int *__s;
  size_t sVar3;
  ulong __n;
  
  __n = -(ulong)(capacity >> 0x3e != 0) | capacity * 4;
  __s = (int *)operator_new__(__n);
  memset(__s,0,__n);
  piVar1 = this->mData;
  sVar2 = this->mSize;
  if (sVar2 == 0) {
    if (piVar1 == (int *)0x0) goto LAB_00101862;
  }
  else {
    sVar3 = 0;
    do {
      __s[sVar3] = piVar1[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  operator_delete__(piVar1);
LAB_00101862:
  this->mData = __s;
  this->mCap = capacity;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[i];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
    }